

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::run_task(search *sch,multi_ex *ec)

{
  long lVar1;
  undefined8 in_RSI;
  long *in_RDI;
  search_private *priv;
  
  lVar1 = *in_RDI;
  *(long *)(lVar1 + 600) = *(long *)(lVar1 + 600) + 1;
  if ((*(long *)(lVar1 + 0x650) == 0) || (*(int *)(lVar1 + 0x6c) == 4)) {
    (**(code **)(*(long *)(lVar1 + 0x648) + 8))(in_RDI,in_RSI);
  }
  else {
    (**(code **)(*(long *)(lVar1 + 0x650) + 8))(in_RDI,in_RSI);
  }
  return;
}

Assistant:

void run_task(search& sch, multi_ex& ec)
{
  search_private& priv = *sch.priv;
  priv.num_calls_to_run++;
  if (priv.metatask && (priv.state != GET_TRUTH_STRING))
    priv.metatask->run(sch, ec);
  else
    priv.task->run(sch, ec);
}